

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O1

bool libwebm::CopyAndEscapeStartCodes
               (uint8_t *raw_input,size_t raw_input_length,PacketDataBuffer *packet_buffer)

{
  pointer *ppuVar1;
  byte bVar2;
  iterator iVar3;
  undefined8 in_RAX;
  int iVar4;
  size_t i;
  size_t sVar5;
  uint8_t byte;
  undefined8 uStack_38;
  
  if (packet_buffer != (PacketDataBuffer *)0x0 &&
      (raw_input_length != 0 && raw_input != (uint8_t *)0x0)) {
    sVar5 = 0;
    iVar4 = 0;
    uStack_38 = in_RAX;
    do {
      bVar2 = raw_input[sVar5];
      uStack_38._0_7_ = CONCAT16(bVar2,(undefined6)uStack_38);
      if (bVar2 == 0) {
        iVar4 = iVar4 + 1;
      }
      else {
        if ((1 < iVar4) && ((bVar2 & 0xfd) == 1)) {
          uStack_38 = CONCAT17(3,(undefined7)uStack_38);
          iVar3._M_current =
               (packet_buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (packet_buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>(packet_buffer,iVar3,(uchar *)((long)&uStack_38 + 7));
          }
          else {
            *iVar3._M_current = '\x03';
            ppuVar1 = &(packet_buffer->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
        }
        iVar4 = 0;
      }
      iVar3._M_current =
           (packet_buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (packet_buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)packet_buffer,iVar3,
                   (uchar *)((long)&uStack_38 + 6));
      }
      else {
        *iVar3._M_current = uStack_38._6_1_;
        ppuVar1 = &(packet_buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      sVar5 = sVar5 + 1;
    } while (raw_input_length != sVar5);
  }
  return packet_buffer != (PacketDataBuffer *)0x0 &&
         (raw_input_length != 0 && raw_input != (uint8_t *)0x0);
}

Assistant:

bool CopyAndEscapeStartCodes(const std::uint8_t* raw_input,
                             std::size_t raw_input_length,
                             PacketDataBuffer* packet_buffer) {
  if (raw_input == nullptr || raw_input_length < 1 || packet_buffer == nullptr)
    return false;

  int num_zeros = 0;
  for (std::size_t i = 0; i < raw_input_length; ++i) {
    const uint8_t byte = raw_input[i];

    if (byte == 0) {
      ++num_zeros;
    } else if (num_zeros >= 2 && (byte == 0x1 || byte == 0x3)) {
      packet_buffer->push_back(0x3);
      num_zeros = 0;
    } else {
      num_zeros = 0;
    }

    packet_buffer->push_back(byte);
  }

  return true;
}